

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.h
# Opt level: O0

void __thiscall Imf_2_5::TypedFlatImageChannel<float>::resize(TypedFlatImageChannel<float> *this)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  _func_int **pp_Var4;
  ImageChannel *in_RDI;
  size_t i;
  ulong local_10;
  
  if (in_RDI[1]._vptr_ImageChannel != (_func_int **)0x0) {
    operator_delete__(in_RDI[1]._vptr_ImageChannel);
  }
  in_RDI[1]._vptr_ImageChannel = (_func_int **)0x0;
  FlatImageChannel::resize((FlatImageChannel *)0x12765e);
  sVar2 = ImageChannel::numPixels(in_RDI);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pp_Var4 = (_func_int **)operator_new__(uVar3);
  in_RDI[1]._vptr_ImageChannel = pp_Var4;
  local_10 = 0;
  while( true ) {
    sVar2 = ImageChannel::numPixels(in_RDI);
    if (sVar2 <= local_10) break;
    *(undefined4 *)((long)in_RDI[1]._vptr_ImageChannel + local_10 * 4) = 0;
    local_10 = local_10 + 1;
  }
  (*in_RDI->_vptr_ImageChannel[5])();
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete [] _pixels;
    _pixels = 0;

    FlatImageChannel::resize();  // may throw an exception

    _pixels = new T [numPixels()];

    for (size_t i = 0; i < numPixels(); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}